

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldValue(ParserImpl *this)

{
  Tokenizer *this_00;
  string *__lhs;
  bool bVar1;
  __type_conflict _Var2;
  TokenType TVar3;
  allocator local_72;
  allocator local_71;
  string text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->tokenizer_;
  if ((this->tokenizer_).current_.type == TYPE_STRING) {
    TVar3 = TYPE_STRING;
    while (TVar3 == TYPE_STRING) {
      io::Tokenizer::Next(this_00);
      TVar3 = (this_00->current_).type;
    }
    return true;
  }
  std::__cxx11::string::string((string *)&text,"[",(allocator *)&local_50);
  bVar1 = TryConsume(this,&text);
  std::__cxx11::string::~string((string *)&text);
  if (bVar1) {
    __lhs = &(this->tokenizer_).current_.text;
    do {
      std::__cxx11::string::string((string *)&text,"{",&local_71);
      _Var2 = std::operator==(__lhs,&text);
      if (_Var2) {
        std::__cxx11::string::~string((string *)&text);
LAB_00272a41:
        bVar1 = SkipFieldMessage(this);
      }
      else {
        std::__cxx11::string::string((string *)&local_50,"<",&local_72);
        _Var2 = std::operator==(__lhs,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&text);
        if (_Var2) goto LAB_00272a41;
        bVar1 = SkipFieldValue(this);
      }
      if (bVar1 == false) {
        return false;
      }
      std::__cxx11::string::string((string *)&text,"]",(allocator *)&local_50);
      bVar1 = TryConsume(this,&text);
      std::__cxx11::string::~string((string *)&text);
      if (bVar1) {
        return true;
      }
      std::__cxx11::string::string((string *)&text,",",(allocator *)&local_50);
      bVar1 = Consume(this,&text);
      std::__cxx11::string::~string((string *)&text);
      if (!bVar1) {
        return false;
      }
    } while( true );
  }
  std::__cxx11::string::string((string *)&text,"-",(allocator *)&local_50);
  bVar1 = TryConsume(this,&text);
  std::__cxx11::string::~string((string *)&text);
  TVar3 = (this_00->current_).type;
  if (1 < TVar3 - TYPE_INTEGER) {
    if (TVar3 != TYPE_IDENTIFIER) {
      std::__cxx11::string::string((string *)&text,(string *)&(this->tokenizer_).current_.text);
      std::operator+(&local_50,"Cannot skip field value, unexpected token: ",&text);
      ReportError(this,&local_50);
LAB_00272bca:
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&text);
      return false;
    }
    if (bVar1) {
      std::__cxx11::string::string((string *)&text,(string *)&(this->tokenizer_).current_.text);
      LowerString(&text);
      bVar1 = std::operator!=(&text,"inf");
      if (((bVar1) && (bVar1 = std::operator!=(&text,"infinity"), bVar1)) &&
         (bVar1 = std::operator!=(&text,"nan"), bVar1)) {
        std::operator+(&local_50,"Invalid float number: ",&text);
        ReportError(this,&local_50);
        goto LAB_00272bca;
      }
      std::__cxx11::string::~string((string *)&text);
    }
  }
  io::Tokenizer::Next(this_00);
  return true;
}

Assistant:

bool LookingAtType(io::Tokenizer::TokenType token_type) {
    return tokenizer_.current().type == token_type;
  }